

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O2

idx_t duckdb::RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::LessThan>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t i;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  UnifiedVectorFormat left_data;
  idx_t local_d8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  local_d8 = 0;
  for (uVar5 = 0; current_match_count != uVar5; uVar5 = uVar5 + 1) {
    uVar4 = uVar5;
    if (lvector->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)lvector->sel_vector[uVar5];
    }
    uVar1 = uVar5;
    if (rvector->sel_vector != (sel_t *)0x0) {
      uVar1 = (ulong)rvector->sel_vector[uVar5];
    }
    uVar2 = uVar4;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)(local_78.sel)->sel_vector[uVar4];
    }
    uVar3 = uVar1;
    if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)(local_c0.sel)->sel_vector[uVar1];
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0;
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0;
    }
    if (!bVar6 && !bVar7) {
      bVar6 = GreaterThan::Operation<duckdb::hugeint_t>
                        ((hugeint_t *)(local_c0.data + uVar3 * 0x10),
                         (hugeint_t *)(local_78.data + uVar2 * 0x10));
      if (bVar6) {
        lvector->sel_vector[local_d8] = (sel_t)uVar4;
        rvector->sel_vector[local_d8] = (sel_t)uVar1;
        local_d8 = local_d8 + 1;
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return local_d8;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		// refine phase of the nested loop join
		// refine lvector and rvector based on matches of subsequent conditions (in case there are multiple conditions
		// in the join)
		D_ASSERT(current_match_count > 0);
		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (idx_t i = 0; i < current_match_count; i++) {
			auto lidx = lvector.get_index(i);
			auto ridx = rvector.get_index(i);
			auto left_idx = left_data.sel->get_index(lidx);
			auto right_idx = right_data.sel->get_index(ridx);
			bool left_is_valid = left_data.validity.RowIsValid(left_idx);
			bool right_is_valid = right_data.validity.RowIsValid(right_idx);
			if (MATCH_OP::Operation(ldata[left_idx], rdata[right_idx], !left_is_valid, !right_is_valid)) {
				lvector.set_index(result_count, lidx);
				rvector.set_index(result_count, ridx);
				result_count++;
			}
		}
		return result_count;
	}